

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O2

void Fra_ClauReduceClause(Vec_Int_t *vMain,Vec_Int_t *vNew)

{
  int iVar1;
  int iVar2;
  int i;
  int i_00;
  int nSizeNew;
  int iVar3;
  
  iVar1 = vMain->nSize;
  if (vNew->nSize < iVar1) {
    __assert_fail("Vec_IntSize(vMain) <= Vec_IntSize(vNew)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClau.c"
                  ,0x1dc,"void Fra_ClauReduceClause(Vec_Int_t *, Vec_Int_t *)");
  }
  i = 0;
  nSizeNew = 0;
  for (i_00 = 0; (i < iVar1 && (i_00 < vNew->nSize)); i_00 = i_00 + 1) {
    iVar1 = Vec_IntEntry(vMain,i);
    iVar2 = Vec_IntEntry(vNew,i_00);
    if (iVar1 >> 1 < iVar2 >> 1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClau.c"
                    ,0x1e5,"void Fra_ClauReduceClause(Vec_Int_t *, Vec_Int_t *)");
    }
    iVar3 = nSizeNew;
    if (iVar1 >> 1 <= iVar2 >> 1) {
      i = i + 1;
      if (iVar1 == iVar2) {
        iVar3 = nSizeNew + 1;
        Vec_IntWriteEntry(vMain,nSizeNew,iVar1);
      }
    }
    iVar1 = vMain->nSize;
    nSizeNew = iVar3;
  }
  if (i == iVar1) {
    Vec_IntShrink(vMain,nSizeNew);
    return;
  }
  __assert_fail("i == Vec_IntSize(vMain)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClau.c"
                ,499,"void Fra_ClauReduceClause(Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

void Fra_ClauReduceClause( Vec_Int_t * vMain, Vec_Int_t * vNew )
{
    int LitM, LitN, VarM, VarN, i, j, k;
    assert( Vec_IntSize(vMain) <= Vec_IntSize(vNew) );
    for ( i = j = k = 0; i < Vec_IntSize(vMain) && j < Vec_IntSize(vNew); )
    {
        LitM = Vec_IntEntry( vMain, i );
        LitN = Vec_IntEntry( vNew, j );
        VarM = lit_var( LitM );
        VarN = lit_var( LitN );
        if ( VarM < VarN )
        {
            assert( 0 );
        }
        else if ( VarM > VarN )
        {
            j++;
        }
        else // if ( VarM == VarN )
        {
            i++;
            j++;
            if ( LitM == LitN )
                Vec_IntWriteEntry( vMain, k++, LitM );
        }
    }
    assert( i == Vec_IntSize(vMain) );
    Vec_IntShrink( vMain, k );
}